

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WavFileWriter.h
# Opt level: O0

void __thiscall WavFileWriter::~WavFileWriter(WavFileWriter *this)

{
  bool bVar1;
  reference ppWVar2;
  WavFileWriter *this_local;
  
  while( true ) {
    bVar1 = std::__cxx11::list<WavFileElement_*,_std::allocator<WavFileElement_*>_>::empty
                      (&this->m_OutFile);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppWVar2 = std::__cxx11::list<WavFileElement_*,_std::allocator<WavFileElement_*>_>::back
                        (&this->m_OutFile);
    if (*ppWVar2 != (value_type)0x0) {
      (**(code **)(*(long *)*ppWVar2 + 8))();
    }
    std::__cxx11::list<WavFileElement_*,_std::allocator<WavFileElement_*>_>::pop_back
              (&this->m_OutFile);
  }
  std::__cxx11::list<WavFileElement_*,_std::allocator<WavFileElement_*>_>::~list(&this->m_OutFile);
  return;
}

Assistant:

~WavFileWriter()
    {
      while ( ! m_OutFile.empty() )
	{
	  delete m_OutFile.back();
	  m_OutFile.pop_back();
	}
    }